

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlIsRef(xmlDocPtr doc,xmlNodePtr elem,xmlAttrPtr attr)

{
  xmlAttributePtr pxVar1;
  uint uVar2;
  xmlChar *prefix;
  
  uVar2 = 0;
  if ((((attr != (xmlAttrPtr)0x0) &&
       ((doc != (xmlDocPtr)0x0 || (doc = attr->doc, doc != (_xmlDoc *)0x0)))) &&
      ((doc->intSubset != (xmlDtdPtr)0x0 || (doc->extSubset != (_xmlDtd *)0x0)))) &&
     ((uVar2 = 0, elem != (xmlNodePtr)0x0 && (doc->type != XML_HTML_DOCUMENT_NODE)))) {
    if (attr->ns == (xmlNs *)0x0) {
      prefix = (xmlChar *)0x0;
    }
    else {
      prefix = attr->ns->prefix;
    }
    pxVar1 = xmlGetDtdQAttrDesc(doc->intSubset,elem->name,attr->name,prefix);
    if (pxVar1 == (xmlAttributePtr)0x0) {
      if (doc->extSubset == (xmlDtdPtr)0x0) {
        return 0;
      }
      pxVar1 = xmlGetDtdQAttrDesc(doc->extSubset,elem->name,attr->name,prefix);
      if (pxVar1 == (xmlAttributePtr)0x0) {
        return 0;
      }
    }
    uVar2 = (uint)(pxVar1->atype - XML_ATTRIBUTE_IDREF < 2);
  }
  return uVar2;
}

Assistant:

int
xmlIsRef(xmlDocPtr doc, xmlNodePtr elem, xmlAttrPtr attr) {
    if (attr == NULL)
        return(0);
    if (doc == NULL) {
        doc = attr->doc;
	if (doc == NULL) return(0);
    }

    if ((doc->intSubset == NULL) && (doc->extSubset == NULL)) {
        return(0);
    } else if (doc->type == XML_HTML_DOCUMENT_NODE) {
        /* TODO @@@ */
        return(0);
    } else {
        xmlAttributePtr attrDecl;
        const xmlChar *aprefix;

        if (elem == NULL) return(0);
        aprefix = (attr->ns != NULL) ? attr->ns->prefix : NULL;
        attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, elem->name, attr->name,
                                      aprefix);
        if ((attrDecl == NULL) && (doc->extSubset != NULL))
            attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, elem->name, attr->name,
                                          aprefix);

	if ((attrDecl != NULL) &&
	    (attrDecl->atype == XML_ATTRIBUTE_IDREF ||
	     attrDecl->atype == XML_ATTRIBUTE_IDREFS))
	return(1);
    }
    return(0);
}